

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t generic_unpack(exr_decode_pipeline_t *decode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint16_t uVar6;
  float fVar7;
  uint32_t ui;
  long lVar8;
  long lVar9;
  long *in_RDI;
  int s_8;
  uint32_t *src_8;
  uint32_t fint_3;
  int s_7;
  uint32_t *src_7;
  uint32_t fint_2;
  int s_6;
  uint32_t *src_6;
  uint32_t fint_1;
  int s_5;
  uint32_t *src_5;
  int s_4;
  uint32_t *src_4;
  uint32_t fint;
  int s_3;
  uint32_t *src_3;
  uint16_t cval_1;
  int s_2;
  uint16_t *src_2;
  uint16_t cval;
  int s_1;
  uint16_t *src_1;
  int s;
  uint16_t *src;
  exr_coding_channel_info_t *decc;
  int c;
  int cury;
  int y;
  int ubpc;
  int bpc;
  int w;
  uint8_t *cdata;
  uint8_t *srcbuffer;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  int local_cc;
  int local_bc;
  int local_ac;
  int local_9c;
  int local_8c;
  int local_7c;
  int local_6c;
  int local_5c;
  int local_4c;
  int local_38;
  int local_30;
  float *local_20;
  
  local_30 = 0;
  do {
    if (*(int *)((long)in_RDI + 0x24) <= local_30) {
      return 0;
    }
    lVar5 = in_RDI[4];
    for (local_38 = 0; local_38 < (short)in_RDI[1]; local_38 = local_38 + 1) {
      lVar8 = *in_RDI + (long)local_38 * 0x30;
      lVar4 = *(long *)(lVar8 + 0x28);
      iVar2 = *(int *)(lVar8 + 0xc);
      iVar3 = *(int *)(lVar8 + 0x20);
      if (*(int *)(lVar8 + 0x14) < 2) {
        if (lVar4 != 0) {
          lVar9 = (long)local_30 * (long)*(int *)(lVar8 + 0x24);
          goto LAB_00153020;
        }
      }
      else if (((local_30 + (int)lVar5) % *(int *)(lVar8 + 0x14) == 0) && (lVar4 != 0)) {
        lVar9 = (long)(local_30 / *(int *)(lVar8 + 0x14)) * (long)*(int *)(lVar8 + 0x24);
LAB_00153020:
        local_20 = (float *)(lVar9 + lVar4);
        sVar1 = *(short *)(lVar8 + 0x1a);
        if (sVar1 == 0) {
          in_stack_ffffffffffffff24 = (uint)*(ushort *)(lVar8 + 0x1e);
          if (in_stack_ffffffffffffff24 == 0) {
            for (local_cc = 0; local_cc < iVar2; local_cc = local_cc + 1) {
              fVar7 = (float)unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                               in_stack_ffffffffffffff20));
              *local_20 = fVar7;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
          else if (in_stack_ffffffffffffff24 == 1) {
            for (local_ac = 0; local_ac < iVar2; local_ac = local_ac + 1) {
              unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              uVar6 = uint_to_half(0x1534a6);
              *(uint16_t *)local_20 = uVar6;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
          else {
            if (in_stack_ffffffffffffff24 != 2) {
              return 3;
            }
            for (local_bc = 0; local_bc < iVar2; local_bc = local_bc + 1) {
              ui = unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                     in_stack_ffffffffffffff20));
              fVar7 = uint_to_float(ui);
              *local_20 = fVar7;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
        }
        else if (sVar1 == 1) {
          sVar1 = *(short *)(lVar8 + 0x1e);
          if (sVar1 == 0) {
            for (local_6c = 0; local_6c < iVar2; local_6c = local_6c + 1) {
              unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              fVar7 = (float)half_to_uint(0x15);
              *local_20 = fVar7;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
          else if (sVar1 == 1) {
            for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
              uVar6 = unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                        in_stack_ffffffffffffff20));
              *(uint16_t *)local_20 = uVar6;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
          else {
            if (sVar1 != 2) {
              return 3;
            }
            for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
              uVar6 = unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                        in_stack_ffffffffffffff20));
              fVar7 = half_to_float(uVar6);
              *local_20 = fVar7;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
        }
        else {
          if (sVar1 != 2) {
            return 3;
          }
          sVar1 = *(short *)(lVar8 + 0x1e);
          if (sVar1 == 0) {
            for (local_9c = 0; local_9c < iVar2; local_9c = local_9c + 1) {
              unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              fVar7 = (float)float_to_uint_int(0);
              *local_20 = fVar7;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
          else if (sVar1 == 1) {
            for (local_7c = 0; local_7c < iVar2; local_7c = local_7c + 1) {
              unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              uVar6 = float_to_half_int(0);
              *(uint16_t *)local_20 = uVar6;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
          else {
            if (sVar1 != 2) {
              return 3;
            }
            for (local_8c = 0; local_8c < iVar2; local_8c = local_8c + 1) {
              fVar7 = (float)unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                               in_stack_ffffffffffffff20));
              *local_20 = fVar7;
              local_20 = (float *)((long)local_20 + (long)iVar3);
            }
          }
        }
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, bpc, ubpc;

    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            w     = decc->width;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_pixel_stride;

            if (decc->y_samples > 1)
            {
                if ((cury % decc->y_samples) != 0) continue;
                if (cdata)
                    cdata +=
                        ((uint64_t) (y / decc->y_samples) *
                         (uint64_t) decc->user_line_stride);
                else
                {
                    srcbuffer += w * bpc;
                    continue;
                }
            }
            else if (cdata)
            {
                cdata += ((uint64_t) y) * ((uint64_t) decc->user_line_stride);
            }
            else
            {
                srcbuffer += w * bpc;
                continue;
            }

            UNPACK_SAMPLES (w)
            srcbuffer += w * bpc;
        }
    }
    return EXR_ERR_SUCCESS;
}